

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainer.cpp
# Opt level: O0

void __thiscall
adios2::burstbuffer::FileDrainer::AddOperationOpen(FileDrainer *this,string *toFileName,Mode mode)

{
  int in_EDX;
  string emptyStr;
  allocator local_e1;
  string local_e0 [4];
  int in_stack_ffffffffffffff24;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  string local_b8 [39];
  allocator local_91;
  string local_90 [8];
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string local_68 [4];
  DrainOperation in_stack_ffffffffffffff9c;
  FileDrainer *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  string local_38 [36];
  int local_14;
  
  local_14 = in_EDX;
  std::__cxx11::string::string(local_38);
  if (local_14 == 1) {
    AddOperation(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  }
  else if (local_14 == 3) {
    AddOperation(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Toolkit",(allocator *)&stack0xffffffffffffff97);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"BurstBuffer::FileDrainer",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"AddOperationOpen",(allocator *)&stack0xffffffffffffff47);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"only supports Write and Append modes",&local_e1);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void FileDrainer::AddOperationOpen(const std::string &toFileName, Mode mode)
{
    std::string emptyStr;
    if (mode == Mode::Write)
    {
        AddOperation(DrainOperation::Create, emptyStr, toFileName, 0, 0, 0);
    }
    else if (mode == Mode::Append)
    {
        AddOperation(DrainOperation::Open, emptyStr, toFileName, 0, 0, 0);
    }
    else
    {
        helper::Throw<std::runtime_error>("Toolkit", "BurstBuffer::FileDrainer", "AddOperationOpen",
                                          "only supports Write and Append modes");
    }
}